

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

int Ssw_RarManPoIsConst0(void *pMan,Aig_Obj_t *pObj)

{
  word *pwVar1;
  word *pwVar2;
  long lVar3;
  
  pwVar2 = Ssw_RarObjSim((Ssw_RarMan_t *)pMan,pObj->Id);
  lVar3 = 0;
  do {
    if (*(int *)(*pMan + 4) <= lVar3) {
      return 1;
    }
    pwVar1 = pwVar2 + lVar3;
    lVar3 = lVar3 + 1;
  } while (*pwVar1 == 0);
  return 0;
}

Assistant:

int Ssw_RarManPoIsConst0( void * pMan, Aig_Obj_t * pObj )
{
    Ssw_RarMan_t * p = (Ssw_RarMan_t *)pMan;
    word * pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
    int w;
    for ( w = 0; w < p->pPars->nWords; w++ )
        if ( pSim[w] )
            return 0;
    return 1;
}